

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

Context * build_context(char *profile,char *mainfn,uchar *tokenbuf,uint bufsize,
                       MOJOSHADER_swizzle *swiz,uint swizcount,MOJOSHADER_samplerMap *smap,
                       uint smapcount,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  Context *ctx;
  ErrorList *pEVar2;
  Buffer *pBVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  Profile *pPVar7;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  if (f == (MOJOSHADER_free)0x0) {
    f = MOJOSHADER_internal_free;
  }
  ctx = (Context *)(*m)(0x580,d);
  if (ctx != (Context *)0x0) {
    memset(ctx,0,0x580);
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    ctx->tokens = (uint32 *)tokenbuf;
    ctx->orig_tokens = (uint32 *)tokenbuf;
    ctx->know_shader_size = (uint)(bufsize != 0);
    ctx->tokencount = -(uint)(bufsize == 0) | bufsize >> 2;
    ctx->swizzles = swiz;
    ctx->swizzles_count = swizcount;
    ctx->samplermap = smap;
    ctx->samplermap_count = smapcount;
    ctx->endline = "\n";
    ctx->endline_len = 1;
    ctx->last_address_reg_component = -1;
    ctx->current_position = -2;
    ctx->texm3x2pad_dst0 = -1;
    ctx->texm3x2pad_src0 = -1;
    ctx->texm3x3pad_dst0 = -1;
    ctx->texm3x3pad_src0 = -1;
    ctx->texm3x3pad_dst1 = -1;
    ctx->texm3x3pad_src1 = -1;
    pEVar2 = errorlist_create(MallocBridge,FreeBridge,ctx);
    ctx->errors = pEVar2;
    if (pEVar2 != (ErrorList *)0x0) {
      pBVar3 = ctx->mainline;
      if (pBVar3 != (Buffer *)0x0) {
LAB_00108fb8:
        ctx->output = pBVar3;
        if (mainfn != (char *)0x0) {
          sVar4 = strlen(mainfn);
          if (sVar4 < 0x38) {
            sVar4 = strlen(mainfn);
            pcVar5 = (char *)(*ctx->malloc)((int)sVar4 + 1,ctx->malloc_data);
            if (pcVar5 == (char *)0x0) {
              ctx->isfail = 1;
              ctx->out_of_memory = 1;
            }
            else {
              strcpy(pcVar5,mainfn);
            }
            ctx->mainfn = pcVar5;
          }
          else {
            failf(ctx,"Main function name \'%s\' is too big",mainfn);
          }
        }
        if (profile == (char *)0x0) {
          return ctx;
        }
        lVar6 = 8;
        do {
          iVar1 = strcmp(*(char **)(&UNK_0013e048 + lVar6),profile);
          if (iVar1 == 0) {
            pcVar5 = *(char **)((long)&profileMap[0].from + lVar6);
            break;
          }
          lVar6 = lVar6 + 0x10;
          pcVar5 = profile;
        } while (lVar6 != 0x58);
        pPVar7 = profiles;
        lVar6 = 0;
        do {
          iVar1 = strcmp(pPVar7->name,pcVar5);
          if (iVar1 == 0) {
            ctx->profileid = (int)lVar6;
            ctx->profile = pPVar7;
            return ctx;
          }
          lVar6 = lVar6 + 1;
          pPVar7 = pPVar7 + 1;
        } while (lVar6 != 5);
        ctx->profileid = -1;
        failf(ctx,"Profile \'%s\' is unknown or unsupported",profile);
        return ctx;
      }
      pBVar3 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
      ctx->mainline = pBVar3;
      if (pBVar3 != (Buffer *)0x0) goto LAB_00108fb8;
      errorlist_destroy(ctx->errors);
    }
    (*f)(ctx,d);
  }
  return (Context *)0x0;
}

Assistant:

static Context *build_context(const char *profile,
                              const char *mainfn,
                              const unsigned char *tokenbuf,
                              const unsigned int bufsize,
                              const MOJOSHADER_swizzle *swiz,
                              const unsigned int swizcount,
                              const MOJOSHADER_samplerMap *smap,
                              const unsigned int smapcount,
                              MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    if (m == NULL) m = MOJOSHADER_internal_malloc;
    if (f == NULL) f = MOJOSHADER_internal_free;

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    ctx->tokens = (const uint32 *) tokenbuf;
    ctx->orig_tokens = (const uint32 *) tokenbuf;
    ctx->know_shader_size = (bufsize != 0);
    ctx->tokencount = ctx->know_shader_size ? (bufsize / sizeof (uint32)) : 0xFFFFFFFF;
    ctx->swizzles = swiz;
    ctx->swizzles_count = swizcount;
    ctx->samplermap = smap;
    ctx->samplermap_count = smapcount;
    ctx->endline = ENDLINE_STR;
    ctx->endline_len = strlen(ctx->endline);
    ctx->last_address_reg_component = -1;
    ctx->current_position = MOJOSHADER_POSITION_BEFORE;
    ctx->texm3x2pad_dst0 = -1;
    ctx->texm3x2pad_src0 = -1;
    ctx->texm3x3pad_dst0 = -1;
    ctx->texm3x3pad_src0 = -1;
    ctx->texm3x3pad_dst1 = -1;
    ctx->texm3x3pad_src1 = -1;

    ctx->errors = errorlist_create(MallocBridge, FreeBridge, ctx);
    if (ctx->errors == NULL)
    {
        f(ctx, d);
        return NULL;
    } // if

    if (!set_output(ctx, &ctx->mainline))
    {
        errorlist_destroy(ctx->errors);
        f(ctx, d);
        return NULL;
    } // if

    if (mainfn != NULL)
    {
        if (strlen(mainfn) > 55)  // !!! FIXME: just to keep things sane. Lots of hardcoded stack arrays...
            failf(ctx, "Main function name '%s' is too big", mainfn);
        else
            ctx->mainfn = StrDup(ctx, mainfn);
    } // if

    if (profile != NULL)
    {
        const int profileid = find_profile_id(profile);
        ctx->profileid = profileid;
        if (profileid >= 0)
            ctx->profile = &profiles[profileid];
        else
            failf(ctx, "Profile '%s' is unknown or unsupported", profile);
    } // if

    return ctx;
}